

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionInliningCase::generateProgramData
          (ProgramData *__return_storage_ptr__,FunctionInliningCase *this,bool optimized)

{
  undefined7 in_register_00000011;
  int local_124;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string mainValueStatement;
  undefined1 local_98 [8];
  string maybeFuncDefs;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string expression;
  string precision;
  bool optimized_local;
  FunctionInliningCase *this_local;
  
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            ((string *)((long)&expression.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)(this->super_ShaderOptimizationCase).m_caseShaderType,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"value*vec4(0.8, 0.7, 0.6, 0.9)",&local_61);
  std::allocator<char>::~allocator(&local_61);
  mainValueStatement.field_2._M_local_buf[0xe] = '\0';
  if (optimized) {
    std::allocator<char>::allocator();
    mainValueStatement.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"",
               (allocator<char> *)(mainValueStatement.field_2._M_local_buf + 0xf));
  }
  else {
    funcDefinitions((string *)local_98,this->m_callNestingDepth,
                    (string *)((long)&expression.field_2 + 8),(string *)local_60);
  }
  if ((mainValueStatement.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)(mainValueStatement.field_2._M_local_buf + 0xf));
  }
  if (!optimized) {
    local_124 = this->m_callNestingDepth + -1;
    de::toString<int>(&local_120,&local_124);
    std::operator+(&local_100,"\tvalue = func",&local_120);
    std::operator+(&local_e0,&local_100,"(value)");
  }
  else {
    std::operator+(&local_e0,"\tvalue = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 &local_e0,";\n");
  std::__cxx11::string::~string((string *)&local_e0);
  if (!optimized) {
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     (string *)local_98,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(expression.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string precision				= getShaderPrecision(m_caseShaderType);
		const string expression				= "value*vec4(0.8, 0.7, 0.6, 0.9)";
		const string maybeFuncDefs			= optimized ? "" : funcDefinitions(m_callNestingDepth, precision, expression);
		const string mainValueStatement		= (optimized ? "\tvalue = " + expression : "\tvalue = func" + toString(m_callNestingDepth-1) + "(value)") + ";\n";

		return defaultProgramData(m_caseShaderType, maybeFuncDefs, mainValueStatement);
	}